

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O0

void __thiscall CChromeTracer::addStartTimeMetadata(CChromeTracer *this,uint64_t startTime)

{
  ostream *poVar1;
  ulong in_RSI;
  long in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x40),
                           "{\"ph\":\"M\",\"name\":\"clintercept_start_time\",\"pid\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x30));
  poVar1 = std::operator<<(poVar1,",\"tid\":0");
  poVar1 = std::operator<<(poVar1,",\"args\":{\"start_time\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1,"}},\n");
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x224389);
  return;
}

Assistant:

void addStartTimeMetadata(
            uint64_t startTime )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"clintercept_start_time\",\"pid\":" << m_ProcessId
            << ",\"tid\":0"
            << ",\"args\":{\"start_time\":" << startTime
            << "}},\n";
    }